

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertEqualStringArray
               (void *expected,char **actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  char *pcVar1;
  char *pcVar2;
  char *actual_00;
  int iVar3;
  UNITY_UINT UVar4;
  ulong uVar5;
  char *expected_00;
  char *number;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_0010f252:
      UnityAddMsgIfSpecified(msg);
    }
    else {
      if ((char **)expected == actual) {
        return;
      }
      iVar3 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar3 == 0) {
        number = (char *)0x0;
        expected_00 = (char *)expected;
        if (flags == UNITY_ARRAY_TO_ARRAY) {
          expected_00 = number;
        }
        UVar4 = Unity.CurrentTestFailed;
        do {
          if (flags == UNITY_ARRAY_TO_ARRAY) {
            expected_00 = *(char **)((long)expected + (long)number * 8);
          }
          actual_00 = actual[(long)number];
          if (actual_00 == (char *)0x0 || expected_00 == (char *)0x0) {
            if (expected_00 != actual_00) goto LAB_0010f1f5;
          }
          else {
            uVar5 = 0;
            do {
              pcVar1 = expected_00 + uVar5;
              if ((*pcVar1 == '\0') && (actual_00[uVar5] == '\0')) goto LAB_0010f205;
              pcVar2 = actual_00 + uVar5;
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (*pcVar1 == *pcVar2);
LAB_0010f1f5:
            Unity.CurrentTestFailed = 1;
            UVar4 = 1;
          }
LAB_0010f205:
          if (UVar4 != 0) {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements != 1) {
              UnityPrint(" Element ");
              UnityPrintNumberUnsigned((UNITY_UINT)number);
            }
            UnityPrintExpectedAndActualStrings(expected_00,actual_00);
            goto LAB_0010f252;
          }
          number = number + 1;
          if (number == (char *)(ulong)num_elements) {
            return;
          }
        } while( true );
      }
    }
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualStringArray(UNITY_INTERNAL_PTR expected,
                                 const char** actual,
                                 const UNITY_UINT32 num_elements,
                                 const char* msg,
                                 const UNITY_LINE_TYPE lineNumber,
                                 const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 i = 0;
    UNITY_UINT32 j = 0;
    const char* expd = NULL;
    const char* act = NULL;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if no elements, it's an error */
    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if ((const void*)expected == (const void*)actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    if (flags != UNITY_ARRAY_TO_ARRAY)
    {
        expd = (const char*)expected;
    }

    do
    {
        act = actual[j];
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            expd = ((const char* const*)expected)[j];
        }

        /* if both pointers not null compare the strings */
        if (expd && act)
        {
            for (i = 0; expd[i] || act[i]; i++)
            {
                if (expd[i] != act[i])
                {
                    Unity.CurrentTestFailed = 1;
                    break;
                }
            }
        }
        else
        { /* handle case of one pointers being null (if both null, test should pass) */
            if (expd != act)
            {
                Unity.CurrentTestFailed = 1;
            }
        }

        if (Unity.CurrentTestFailed)
        {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements > 1)
            {
                UnityPrint(UnityStrElement);
                UnityPrintNumberUnsigned(j);
            }
            UnityPrintExpectedAndActualStrings(expd, act);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
    } while (++j < num_elements);
}